

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O3

void __thiscall
CCoinsViewDB::CCoinsViewDB(CCoinsViewDB *this,DBParams db_params,CoinsViewOptions options)

{
  undefined4 uVar1;
  long lVar2;
  CDBWrapper *this_00;
  int in_ECX;
  path *__p;
  long in_FS_OFFSET;
  
  __p = (path *)options.batch_write_bytes;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CCoinsView)._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_00afe4d0;
  std::filesystem::__cxx11::path::path((path *)&this->m_db_params,__p);
  uVar1 = (undefined4)__p[1]._M_pathname._M_string_length;
  (this->m_db_params).memory_only = (bool)(char)uVar1;
  (this->m_db_params).wipe_data = (bool)(char)((uint)uVar1 >> 8);
  (this->m_db_params).obfuscate = (bool)(char)((uint)uVar1 >> 0x10);
  (this->m_db_params).options = (DBOptions)(char)((uint)uVar1 >> 0x18);
  (this->m_db_params).cache_bytes = (size_t)__p[1]._M_pathname._M_dataplus._M_p;
  (this->m_options).batch_write_bytes = options._8_8_;
  (this->m_options).simulate_crash_ratio = in_ECX;
  this_00 = (CDBWrapper *)operator_new(0x70);
  CDBWrapper::CDBWrapper(this_00,&this->m_db_params);
  (this->m_db)._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl = this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsViewDB::CCoinsViewDB(DBParams db_params, CoinsViewOptions options) :
    m_db_params{std::move(db_params)},
    m_options{std::move(options)},
    m_db{std::make_unique<CDBWrapper>(m_db_params)} { }